

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Context.cpp
# Opt level: O2

void __thiscall aeron::archive::Context::conclude(Context *this)

{
  undefined1 local_170 [40];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_148 [38];
  
  if ((this->aeronDirectoryName_)._M_string_length == 0) {
    memset((Context *)(local_170 + 0x20),0,0x138);
    aeron::Context::Context((Context *)(local_170 + 0x20));
    aeron::Context::defaultAeronPath_abi_cxx11_();
    std::__cxx11::string::operator=((string *)&this->aeronDirectoryName_,(string *)local_170);
    std::__cxx11::string::~string((string *)local_170);
    aeron::Context::~Context((Context *)(local_170 + 0x20));
  }
  if ((this->aeron_).super___shared_ptr<aeron::Aeron,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0) {
    memset((Context *)(local_170 + 0x20),0,0x138);
    aeron::Context::Context((Context *)(local_170 + 0x20));
    std::make_shared<aeron::Context,aeron::Context>((Context *)local_170);
    std::__shared_ptr<aeron::Context,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&(this->aeronContext_).super___shared_ptr<aeron::Context,_(__gnu_cxx::_Lock_policy)2>
               ,(__shared_ptr<aeron::Context,_(__gnu_cxx::_Lock_policy)2> *)local_170);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_170 + 8));
    aeron::Context::~Context((Context *)(local_170 + 0x20));
    std::__cxx11::string::_M_assign
              ((string *)
               (this->aeronContext_).super___shared_ptr<aeron::Context,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr);
    std::make_shared<aeron::Aeron,aeron::Context&>((Context *)(local_170 + 0x20));
    std::__shared_ptr<aeron::Aeron,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&(this->aeron_).super___shared_ptr<aeron::Aeron,_(__gnu_cxx::_Lock_policy)2>,
               (__shared_ptr<aeron::Aeron,_(__gnu_cxx::_Lock_policy)2> *)(local_170 + 0x20));
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_148);
  }
  return;
}

Assistant:

void Context::conclude() {
    if (aeronDirectoryName_.empty()) {
        aeronDirectoryName_ = aeron::Context().defaultAeronPath();
    }

    if (!aeron_) {
        aeronContext_ = std::make_shared<aeron::Context>(aeron::Context());
        aeronContext_->aeronDir(aeronDirectoryName_);
        aeron_ = aeron::Aeron::connect(*aeronContext_);
    }
}